

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmfilegen.cpp
# Opt level: O3

CommandOptions * CreateLargeFile(CommandOptions *Options)

{
  byte_t (*pabVar1) [8];
  byte_t abVar2 [8];
  uint *puVar3;
  ulong uVar4;
  long in_RSI;
  ui32_t write_count;
  ByteString FB;
  FileWriter Writer;
  CTR_Setup counter;
  ByteString local_220 [8];
  uint *local_218;
  int local_210;
  FileWriter local_208 [56];
  Result_t local_1d0 [104];
  Result_t local_168 [104];
  CTR_Setup local_100;
  
  Kumu::FileWriter::FileWriter(local_208);
  Kumu::ByteString::ByteString(local_220);
  Kumu::ByteString::Capacity((uint)local_168);
  Kumu::Result_t::~Result_t(local_168);
  if (local_210 != 0x100000) {
    __assert_fail("FB.Capacity() == Megabyte",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/kmfilegen.cpp"
                  ,0x12e,"Result_t CreateLargeFile(CommandOptions &)");
  }
  fprintf(_stderr,"Writing %u chunks:\n",(ulong)*(uint *)(in_RSI + 0x58));
  s_Nonce = *(ui32_t *)(in_RSI + 0x58);
  Kumu::FileWriter::OpenWrite((string *)Options);
  if ((*(int *)Options < 0) || (*(int *)(in_RSI + 0x58) == 0)) {
    fputs("\n",_stderr);
    Kumu::ByteString::~ByteString(local_220);
    Kumu::FileWriter::~FileWriter(local_208);
    return Options;
  }
  if ((local_218 == (uint *)0x0) ||
     (CTR_Setup::SetupWrite(&local_100,(byte_t *)local_218), puVar3 = local_218,
     local_218 == (uint *)0x0)) {
    __assert_fail("m_Data",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.h"
                  ,0x224,"byte_t *Kumu::ByteString::Data()");
  }
  uVar4 = 0;
  do {
    abVar2[4] = (undefined1)local_100.m_ctr;
    abVar2[5] = local_100.m_ctr._1_1_;
    abVar2[6] = local_100.m_ctr._2_1_;
    abVar2[7] = local_100.m_ctr._3_1_;
    abVar2[0] = (undefined1)local_100.m_nonce;
    abVar2[1] = local_100.m_nonce._1_1_;
    abVar2[2] = local_100.m_nonce._2_1_;
    abVar2[3] = local_100.m_nonce._3_1_;
    pabVar1 = (byte_t (*) [8])((long)puVar3 + uVar4 + 0x20);
    *pabVar1 = local_100.m_preamble;
    pabVar1[1] = abVar2;
    Kumu::AES_encrypt(&local_100.m_Context,(uchar *)((long)puVar3 + uVar4 + 0x20));
    local_100.m_ctr = local_100.m_ctr + 1;
    uVar4 = uVar4 + 0x10;
  } while (uVar4 < 0xfffd1);
  if (local_218 != (uint *)0x0) {
    Kumu::FileWriter::Write((uchar *)local_1d0,(uint)local_208,local_218);
    Kumu::Result_t::operator=((Result_t *)Options,local_1d0);
    Kumu::Result_t::~Result_t(local_1d0);
    __assert_fail("write_count == Megabyte",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/kmfilegen.cpp"
                  ,0x13c,"Result_t CreateLargeFile(CommandOptions &)");
  }
  __assert_fail("m_Data",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_util.h"
                ,0x221,"const byte_t *Kumu::ByteString::RoData() const");
}

Assistant:

Result_t
CreateLargeFile(CommandOptions& Options)
{
  ui32_t write_total = 0;
  ui32_t write_count = 0;
  FileWriter  Writer;
  ByteString  FB;

  FB.Capacity(Megabyte);
  assert(FB.Capacity() == Megabyte);

  fprintf(stderr, "Writing %u chunks:\n", Options.chunk_count);
  s_Nonce = Options.chunk_count;
  Result_t result = Writer.OpenWrite(Options.filename);

  while ( KM_SUCCESS(result) && write_total < Options.chunk_count )
    {
      if ( KM_SUCCESS(result))
	{
	  CTR_Setup counter;
	  counter.SetupWrite(FB.Data());
	  counter.FillRandom(FB.Data() + counter.WriteSize(), Megabyte - counter.WriteSize());
	  result = Writer.Write(FB.RoData(), Megabyte, &write_count);
	  assert(write_count == Megabyte);
	  fprintf(stderr, "\r%8u ", ++write_total);
	}
    }
  
  fputs("\n", stderr);

  return result;
}